

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  int i;
  long lVar1;
  int a;
  int n2;
  int n1;
  vector<int> v1;
  vector<int> v2;
  int la;
  int fi;
  int po;
  
  CP::vector<int>::vector(&v1);
  CP::vector<int>::vector(&v2);
  __isoc99_scanf("%d",&n1);
  CP::vector<int>::resize(&v1,(long)n1);
  for (lVar1 = 0; lVar1 < n1; lVar1 = lVar1 + 1) {
    __isoc99_scanf("%d",&a);
    v1.mData[lVar1] = a;
  }
  __isoc99_scanf("%d",&n2);
  CP::vector<int>::resize(&v2,(long)n2);
  for (lVar1 = 0; lVar1 < n2; lVar1 = lVar1 + 1) {
    __isoc99_scanf("%d",&a);
    v2.mData[lVar1] = a;
  }
  __isoc99_scanf("%d %d %d",&po,&fi,&la);
  CP::vector<int>::insert(&v1,v1.mData + po,v2.mData + fi,v2.mData + la);
  puts("Result");
  for (lVar1 = 0; v1.mSize << 2 != lVar1; lVar1 = lVar1 + 4) {
    printf("%d ",(ulong)*(uint *)((long)v1.mData + lVar1));
  }
  putchar(10);
  CP::vector<int>::~vector(&v2);
  CP::vector<int>::~vector(&v1);
  return 0;
}

Assistant:

int main() {
  CP::vector<int> v1,v2;
  //read vector
  int n1,n2,a;
  scanf("%d",&n1);
  v1.resize(n1);
  for (int i = 0;i < n1;i++) {
    scanf("%d",&a);
    v1[i] = a;
  }
  scanf("%d",&n2);
  v2.resize(n2);
  for (int i = 0;i < n2;i++) {
    scanf("%d",&a);
    v2[i] = a;
  }

  //read position
  int po,fi,la;
  scanf("%d %d %d",&po,&fi,&la);
  CP::vector<int>::iterator position,first,last;
  position = v1.begin() + po;
  first = v2.begin() + fi;
  last = v2.begin() + la;

  //call the function
  v1.insert(position,first,last);

  //display result;
  printf("Result\n");
  for (auto &x : v1) {
    printf("%d ",x);
  }
  printf("\n");

  return 0;
}